

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_fan_calib(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_fan_calib_entry *e;
  uint uVar1;
  envy_bios_power_fan_calib_entry *peVar2;
  int16_t iVar3;
  int16_t iVar4;
  long lVar5;
  ulong uVar6;
  int16_t div;
  uint local_c4;
  FILE *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  char model [100];
  
  uVar1 = (bios->power).fan_calib.offset;
  if ((mask >> 10 & 1) != 0 && uVar1 != 0) {
    uVar6 = (ulong)(bios->power).fan_calib.version;
    if ((bios->power).fan_calib.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse FAN CALIBRATION table at 0x%x, version %x\n",(ulong)uVar1
              ,uVar6);
      return;
    }
    fprintf((FILE *)out,"FAN CALIBRATION table at 0x%x, version %x\n",(ulong)uVar1,uVar6);
    envy_bios_dump_hex(bios,out,(bios->power).fan_calib.offset,(uint)(bios->power).fan_calib.hlen,
                       mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).fan_calib.entriesnum != '\0') {
      lVar5 = 0;
      uVar6 = 0;
      local_c4 = mask;
      local_c0 = (FILE *)out;
      do {
        peVar2 = (bios->power).fan_calib.entries;
        if (((&peVar2->enable)[lVar5] == '\x01') && (((&peVar2->mode)[lVar5] & 7) == 1)) {
          if (bios->chipset < 0xc0) {
            memcpy(model,"unsupported chipset",100);
          }
          else {
            e = (envy_bios_power_fan_calib_entry *)((long)&peVar2->offset + lVar5);
            iVar3 = envy_bios_parse_power_fan_calib_model(e,'\0',&div);
            iVar4 = envy_bios_parse_power_fan_calib_model(e,'d',&div);
            snprintf(model,100,"div=0x%hx, duty at 0%% = 0x%hx, duty at 100%% = 0x%hx",
                     (ulong)(uint)(int)div,(ulong)(uint)(int)iVar3,(ulong)(uint)(int)iVar4);
          }
          out = (FILE *)local_c0;
          local_a0 = (ulong)*(ushort *)((long)&peVar2->unk04 + lVar5);
          local_a8 = (ulong)*(ushort *)((long)&peVar2->unk06 + lVar5);
          local_b0 = (ulong)*(ushort *)((long)&peVar2->pwm_freq + lVar5);
          local_b8 = (ulong)*(ushort *)((long)&peVar2->duty_max + lVar5);
          fprintf(local_c0,
                  "-- %i: mode_high %u mode_low %u unk02 %hu unk04 %hu unk06 %hu PWM freq %hu Hz duty max %d duty offset %d unk0e %hi unk10 %hu unk12 %hu (%s) --\n"
                  ,uVar6 & 0xffffffff,(ulong)((&peVar2->mode)[lVar5] >> 4),
                  (ulong)((&peVar2->mode)[lVar5] & 7),
                  (ulong)*(ushort *)((long)&peVar2->unk02 + lVar5),local_a0,local_a8,local_b0,
                  local_b8,(ulong)(uint)(int)*(short *)((long)&peVar2->duty_offset + lVar5),
                  (ulong)(uint)(int)*(short *)((long)&peVar2->unk0e + lVar5),
                  (ulong)*(ushort *)((long)&peVar2->unk10 + lVar5),
                  (ulong)*(ushort *)((long)&peVar2->unk12 + lVar5),model);
          mask = local_c4;
        }
        envy_bios_dump_hex(bios,out,*(uint *)((long)&((bios->power).fan_calib.entries)->offset +
                                             lVar5),(uint)(bios->power).fan_calib.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x18;
      } while (uVar6 < (bios->power).fan_calib.entriesnum);
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void envy_bios_print_power_fan_calib(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_fan_calib *fan_calib = &bios->power.fan_calib;
	int i;

	if (!fan_calib->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!fan_calib->valid) {
		fprintf(out, "Failed to parse FAN CALIBRATION table at 0x%x, version %x\n", fan_calib->offset, fan_calib->version);
		return;
	}

	fprintf(out, "FAN CALIBRATION table at 0x%x, version %x\n", fan_calib->offset, fan_calib->version);
	envy_bios_dump_hex(bios, out, fan_calib->offset, fan_calib->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < fan_calib->entriesnum; i++) {
		struct envy_bios_power_fan_calib_entry *e = &fan_calib->entries[i];
		if (e->enable == 1 && (e->mode & 0x7) == 1) {
			char model[100];

			/* TODO: figure out the nvaX case */
			if (bios->chipset >= 0xc0) {
				int16_t div, low, high;
				low = envy_bios_parse_power_fan_calib_model(e, 0, &div);
				high = envy_bios_parse_power_fan_calib_model(e, 100, &div);

				snprintf(model, sizeof(model),
				         "div=0x%hx, duty at 0%% = 0x%hx, duty at 100%% = 0x%hx",
				         div, low, high);
			} else {
				strncpy(model, "unsupported chipset", sizeof(model));
			}


			fprintf(out, "-- %i: mode_high %u mode_low %u unk02 %hu unk04 %hu "
					"unk06 %hu PWM freq %hu Hz duty max %d duty offset %d "
					"unk0e %hi unk10 %hu unk12 %hu (%s) --\n",
					i, e->mode >> 4, e->mode & 0x7, e->unk02, e->unk04, e->unk06,
					e->pwm_freq, e->duty_max, e->duty_offset, e->unk0e,
					e->unk10, e->unk12, model);
		}

		envy_bios_dump_hex(bios, out, fan_calib->entries[i].offset, fan_calib->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}